

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wcssub.c
# Opt level: O0

int ffgiwcs(fitsfile *fptr,char **header,int *status)

{
  int *in_RDX;
  fitsfile *in_RSI;
  char **in_RDI;
  int hdutype;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (*in_RDX < 1) {
    ffghdt(in_RSI,in_RDX,(int *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    if (in_stack_ffffffffffffffdc == 0) {
      iVar1 = ffh2st((fitsfile *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     in_RDI,&in_RSI->HDUposition);
      if (iVar1 < 1) {
        iVar1 = *in_RDX;
      }
      else {
        ffpmsg((char *)0x26204b);
        iVar1 = *in_RDX;
      }
    }
    else {
      ffpmsg((char *)0x262011);
      *in_RDX = 0xe9;
      iVar1 = 0xe9;
    }
  }
  else {
    iVar1 = *in_RDX;
  }
  return iVar1;
}

Assistant:

int ffgiwcs(fitsfile *fptr,  /* I - FITS file pointer                    */
           char **header,   /* O - pointer to the WCS related keywords  */
           int *status)     /* IO - error status                        */
/*
  int fits_get_image_wcs_keys 
  return a string containing all the image WCS header keywords.
  This string is then used as input to the wcsinit WCSlib routine.
  
  THIS ROUTINE IS DEPRECATED. USE fits_hdr2str INSTEAD
*/
{
    int hdutype;

    if (*status > 0)
        return(*status);

    fits_get_hdu_type(fptr, &hdutype, status);
    if (hdutype != IMAGE_HDU)
    {
      ffpmsg(
     "Error in ffgiwcs. This HDU is not an image. Can't read WCS keywords");
      return(*status = NOT_IMAGE);
    }

    /* read header keywords into a long string of chars */
    if (ffh2st(fptr, header, status) > 0)
    {
        ffpmsg("error creating string of image WCS keywords (ffgiwcs)");
        return(*status);
    }

    return(*status);
}